

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.h
# Opt level: O3

int __thiscall CCommandManager::RemoveCommand(CCommandManager *this,char *pCommand)

{
  int iVar1;
  long lVar2;
  long lVar3;
  
  if (0 < (this->m_aCommands).num_elements) {
    lVar3 = 0;
    lVar2 = 0;
    do {
      iVar1 = str_comp(((this->m_aCommands).list)->m_aName + lVar3,pCommand);
      if (iVar1 == 0) {
        if (this->m_pfnRemoveCommandHook != (FRemoveCommandHook)0x0) {
          (*this->m_pfnRemoveCommandHook)
                    ((CCommand *)(((this->m_aCommands).list)->m_aName + lVar3),this->m_pHookContext)
          ;
        }
        array<CCommandManager::CCommand,_allocator_default<CCommandManager::CCommand>_>::
        remove_index(&this->m_aCommands,(int)lVar2);
        return 0;
      }
      lVar2 = lVar2 + 1;
      lVar3 = lVar3 + 0xa0;
    } while (lVar2 < (this->m_aCommands).num_elements);
  }
  return 1;
}

Assistant:

int RemoveCommand(const char *pCommand)
    {
        for(int i = 0; i < m_aCommands.size(); i++)
        {
            if(!str_comp(m_aCommands[i].m_aName, pCommand))
            {
                if(m_pfnRemoveCommandHook)
                    m_pfnRemoveCommandHook(&m_aCommands[i], m_pHookContext);

                m_aCommands.remove_index(i);
                return 0;
            }
        }

        return 1;
    }